

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parametric.cxx
# Opt level: O2

string * __thiscall
Parametric::getConfiguration_abi_cxx11_(string *__return_storage_ptr__,Parametric *this)

{
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::operator+(&local_b0,"\"",&this->parametricName);
  std::operator+(&local_90,&local_b0,"\" ");
  std::operator+(&local_70,&local_90,&this->parametricType);
  std::operator+(&local_50,&local_70,'\n');
  getAllParameters_abi_cxx11_(&local_d0,this);
  std::operator+(&local_30,&local_50,&local_d0);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

string Parametric::getConfiguration() const
{
	string config;
	config += "\"" + parametricName + "\" " + parametricType + '\n' + getAllParameters();
	return config;
}